

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::IncompleteTextureAccess::SamplerTest::iterate(SamplerTest *this)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  qpTestResult testResult;
  TestContext *this_00;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  if (bVar1) {
    PrepareFramebuffer(this);
    PrepareVertexArrays(this);
    bVar1 = true;
    lVar5 = 0;
    do {
      PrepareProgram(this,*(Configuration *)(s_configurations + lVar5));
      PrepareTexture(this,*(Configuration *)(s_configurations + lVar5));
      Draw(this);
      bVar2 = Check(this,*(Configuration *)(s_configurations + lVar5));
      if (!bVar2) {
        local_1b0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   "Incomplete texture sampler access test failed with sampler ",0x3b);
        pcVar4 = *(char **)(s_configurations + lVar5 + 8);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar3 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar4,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar1 = false;
      }
      CleanCase(this);
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != 600);
    CleanCase(this);
    CleanTest(this);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar1) {
      pcVar4 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      pcVar4 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar4 = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,pcVar4);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SamplerTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));

	if (!is_at_least_gl_45)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareFramebuffer();
		PrepareVertexArrays();

		for (glw::GLuint i = 0; i < s_configurations_count; ++i)
		{
			PrepareProgram(s_configurations[i]);
			PrepareTexture(s_configurations[i]);

			Draw();

			if (!Check(s_configurations[i]))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Incomplete texture sampler access test failed with sampler "
					<< s_configurations[i].sampler_template << "." << tcu::TestLog::EndMessage;

				is_ok = false;
			}

			CleanCase();
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	CleanCase();
	CleanTest();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}